

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_Uniform.cpp
# Opt level: O1

void __thiscall
Nova::Boundary_Uniform<float,_3>::Find_Ghost_Regions
          (Boundary_Uniform<float,_3> *this,T_Grid *grid,Array<Nova::Range<int,_3>_> *regions,
          int number_of_ghost_cells)

{
  pointer pRVar1;
  int iVar2;
  ulong uVar3;
  undefined8 uVar4;
  long lVar5;
  Vector<int,_3,_true> data_copy_1;
  Vector<int,_3,_true> data_copy;
  Range<int,_3> domain;
  int local_68 [4];
  int local_58 [4];
  int local_48;
  int iStack_44;
  int local_40;
  int local_3c;
  int iStack_38;
  int local_34;
  
  lVar5 = 0;
  Grid<float,_3>::Cell_Indices(grid,0);
  local_58[2] = local_40;
  local_58[0] = local_48;
  local_58[1] = iStack_44;
  do {
    *(int *)((long)local_58 + lVar5) = *(int *)((long)local_58 + lVar5) - number_of_ghost_cells;
    iVar2 = local_58[2];
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0xc);
  local_68[2] = local_34;
  local_68[0] = local_3c;
  local_68[1] = iStack_38;
  lVar5 = 0;
  do {
    *(int *)((long)local_68 + lVar5) = *(int *)((long)local_68 + lVar5) + number_of_ghost_cells;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0xc);
  local_58[3] = local_68[2];
  std::vector<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>::resize(&regions->_data,6)
  ;
  pRVar1 = (regions->_data).
           super__Vector_base<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((regions->_data).
      super__Vector_base<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pRVar1) {
    uVar3 = 0;
    uVar4 = 0;
  }
  else {
    (pRVar1->min_corner)._data._M_elems[0] = local_58[0];
    *(ulong *)((pRVar1->min_corner)._data._M_elems + 1) = CONCAT44(local_40,iStack_44);
    (pRVar1->max_corner)._data._M_elems[0] = local_48 + -1;
    *(ulong *)((pRVar1->max_corner)._data._M_elems + 1) = CONCAT44(local_34,iStack_38);
    pRVar1 = (regions->_data).
             super__Vector_base<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = ((long)(regions->_data).
                   super__Vector_base<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 3) *
            -0x5555555555555555;
    if (uVar3 < 2) {
      uVar4 = 1;
    }
    else {
      pRVar1[1].min_corner._data._M_elems[0] = local_3c + 1;
      *(int *)((long)&pRVar1[1].min_corner._data + 4) = iStack_44;
      *(int *)((long)&pRVar1[1].min_corner._data + 8) = local_40;
      pRVar1[1].max_corner._data._M_elems[0] = local_68[0];
      *(int *)((long)&pRVar1[1].max_corner._data + 4) = iStack_38;
      *(int *)((long)&pRVar1[1].max_corner._data + 8) = local_34;
      pRVar1 = (regions->_data).
               super__Vector_base<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)(regions->_data).
                     super__Vector_base<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 3) *
              -0x5555555555555555;
      if (uVar3 < 3) {
        uVar4 = 2;
      }
      else {
        pRVar1[2].min_corner._data._M_elems[0] = local_58[0];
        *(int *)((long)&pRVar1[2].min_corner._data + 4) = local_58[1];
        *(int *)((long)&pRVar1[2].min_corner._data + 8) = local_40;
        pRVar1[2].max_corner._data._M_elems[0] = local_68[0];
        *(int *)((long)&pRVar1[2].max_corner._data + 4) = iStack_44 + -1;
        *(int *)((long)&pRVar1[2].max_corner._data + 8) = local_34;
        pRVar1 = (regions->_data).
                 super__Vector_base<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar3 = ((long)(regions->_data).
                       super__Vector_base<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 3) *
                -0x5555555555555555;
        if (uVar3 < 4) {
          uVar4 = 3;
        }
        else {
          pRVar1[3].min_corner._data._M_elems[0] = local_58[0];
          *(int *)((long)&pRVar1[3].min_corner._data + 4) = iStack_38 + 1;
          *(int *)((long)&pRVar1[3].min_corner._data + 8) = local_40;
          pRVar1[3].max_corner._data._M_elems[0] = local_68[0];
          *(int *)((long)&pRVar1[3].max_corner._data + 4) = local_68[1];
          *(int *)((long)&pRVar1[3].max_corner._data + 8) = local_34;
          pRVar1 = (regions->_data).
                   super__Vector_base<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar3 = ((long)(regions->_data).
                         super__Vector_base<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 3) *
                  -0x5555555555555555;
          if (uVar3 < 5) {
            uVar4 = 4;
          }
          else {
            pRVar1[4].min_corner._data._M_elems[0] = local_58[0];
            *(int *)((long)&pRVar1[4].min_corner._data + 4) = local_58[1];
            *(int *)((long)&pRVar1[4].min_corner._data + 8) = iVar2;
            pRVar1[4].max_corner._data._M_elems[0] = local_68[0];
            *(int *)((long)&pRVar1[4].max_corner._data + 4) = local_68[1];
            *(int *)((long)&pRVar1[4].max_corner._data + 8) = local_40 + -1;
            pRVar1 = (regions->_data).
                     super__Vector_base<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar3 = ((long)(regions->_data).
                           super__Vector_base<Nova::Range<int,_3>,_std::allocator<Nova::Range<int,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1 >> 3) *
                    -0x5555555555555555;
            if (5 < uVar3) {
              pRVar1[5].min_corner._data._M_elems[0] = local_58[0];
              *(int *)((long)&pRVar1[5].min_corner._data + 4) = local_58[1];
              *(int *)((long)&pRVar1[5].min_corner._data + 8) = local_34 + 1;
              pRVar1[5].max_corner._data._M_elems[0] = local_68[0];
              *(int *)((long)&pRVar1[5].max_corner._data + 4) = local_68[1];
              *(int *)((long)&pRVar1[5].max_corner._data + 8) = local_58[3];
              return;
            }
            uVar4 = 5;
          }
        }
      }
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4,uVar3
            );
}

Assistant:

void Boundary_Uniform<T,d>::
Find_Ghost_Regions(const T_Grid& grid,Array<Range<int,d> >& regions,const int number_of_ghost_cells) const
{
    Range<int,d> domain=grid.Cell_Indices(),ghost=domain.Thickened(number_of_ghost_cells);
    regions.resize(T_Grid::number_of_faces_per_cell);
    Find_Ghost_Regions_Helper(regions,domain,ghost);
}